

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::UCICommand(UCIAdapter *this,char *params)

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  _List_node_base *p_Var6;
  Output local_100;
  long local_f8;
  string author;
  Output out;
  string email;
  string country;
  list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> opts;
  char *params_local;
  string local_50 [32];
  
  params_local = params;
  bVar2 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar2) {
    Output::Output((Output *)&author,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::Uci_abi_cxx11_);
    Output::~Output((Output *)&author);
    Output::Output((Output *)&author,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Output engine info and options followed by uciok.");
    Output::~Output((Output *)&author);
  }
  else {
    (*this->engine->_vptr_ChessEngine[5])(&opts);
    Output::Output((Output *)&country,NoPrefix);
    std::operator<<((ostream *)&std::cout,"id name ");
    (**this->engine->_vptr_ChessEngine)(&author);
    std::operator<<((ostream *)&std::cout,(string *)&author);
    std::operator<<((ostream *)&std::cout,' ');
    (*this->engine->_vptr_ChessEngine[1])(&email);
    std::operator<<((ostream *)&std::cout,(string *)&email);
    std::__cxx11::string::~string((string *)&email);
    std::__cxx11::string::~string((string *)&author);
    Output::~Output((Output *)&country);
    (*this->engine->_vptr_ChessEngine[2])(&author);
    if (author._M_string_length != 0) {
      Output::Output((Output *)&email,NoPrefix);
      std::operator<<((ostream *)&std::cout,"id author ");
      std::operator<<((ostream *)&std::cout,(string *)&author);
      Output::~Output((Output *)&email);
    }
    (*this->engine->_vptr_ChessEngine[3])(&email);
    if (email._M_string_length != 0) {
      Output::Output((Output *)&country,NoPrefix);
      std::operator<<((ostream *)&std::cout,"id email ");
      std::operator<<((ostream *)&std::cout,(string *)&email);
      Output::~Output((Output *)&country);
    }
    (*this->engine->_vptr_ChessEngine[4])(&country);
    if (country._M_string_length != 0) {
      Output::Output(&local_100,NoPrefix);
      std::operator<<((ostream *)&std::cout,"id country ");
      std::operator<<((ostream *)&std::cout,(string *)&country);
      Output::~Output(&local_100);
    }
    p_Var6 = (_List_node_base *)&opts;
    while (p_Var6 = (((_List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)&opts) {
      Output::Output(&out,NoPrefix);
      std::operator<<((ostream *)&std::cout,"option name ");
      p_Var1 = p_Var6 + 1;
      (**(code **)((long)p_Var6[1]._M_next + 8))((string *)&local_100,p_Var1);
      std::operator<<((ostream *)&std::cout,(string *)&local_100);
      std::operator<<((ostream *)&std::cout," type ");
      (**(code **)p_Var1->_M_next)(local_50,p_Var1);
      std::operator<<((ostream *)&std::cout,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&local_100);
      (**(code **)((long)p_Var1->_M_next + 0x20))((string *)&local_100);
      lVar4 = local_f8;
      std::__cxx11::string::~string((string *)&local_100);
      if (lVar4 != 0) {
        std::operator<<((ostream *)&std::cout," default ");
        (**(code **)((long)p_Var1->_M_next + 0x20))((string *)&local_100,p_Var1);
        std::operator<<((ostream *)&std::cout,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
      }
      lVar4 = (**(code **)((long)p_Var1->_M_next + 0x30))(p_Var1);
      if (lVar4 != -0x8000000000000000) {
        std::operator<<((ostream *)&std::cout," min ");
        (**(code **)((long)p_Var1->_M_next + 0x30))(p_Var1);
        std::ostream::_M_insert<long>((long)&std::cout);
      }
      lVar4 = (**(code **)((long)p_Var1->_M_next + 0x38))(p_Var1);
      if (lVar4 != 0x7fffffffffffffff) {
        std::operator<<((ostream *)&std::cout," max ");
        (**(code **)((long)p_Var1->_M_next + 0x38))(p_Var1);
        std::ostream::_M_insert<long>((long)&std::cout);
      }
      lVar4 = (**(code **)((long)p_Var1->_M_next + 0x40))(p_Var1);
      for (p_Var5 = *(_Rb_tree_node_base **)(lVar4 + 0x18);
          p_Var5 != (_Rb_tree_node_base *)(lVar4 + 8);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::operator<<((ostream *)&std::cout," var ");
        std::operator<<((ostream *)&std::cout,(string *)(p_Var5 + 1));
      }
      Output::~Output(&out);
    }
    Output::Output(&local_100,NoPrefix);
    std::operator<<((ostream *)&std::cout,"uciok");
    Output::~Output(&local_100);
    iVar3 = (*this->engine->_vptr_ChessEngine[0x17])();
    if ((char)iVar3 != '\0') {
      Output::Output(&local_100,NoPrefix);
      std::operator<<((ostream *)&std::cout,"copyprotection checking");
      Output::~Output(&local_100);
      iVar3 = (*this->engine->_vptr_ChessEngine[0x18])();
      if ((char)iVar3 == '\0') {
        Output::Output(&local_100,NoPrefix);
        std::operator<<((ostream *)&std::cout,"copyprotection error");
      }
      else {
        Output::Output(&local_100,NoPrefix);
        std::operator<<((ostream *)&std::cout,"copyprotection ok");
      }
      Output::~Output(&local_100);
    }
    iVar3 = (*this->engine->_vptr_ChessEngine[0x14])();
    if ((char)iVar3 == '\0') {
      Output::Output(&local_100,NoPrefix);
      std::operator<<((ostream *)&std::cout,"registration error");
      Output::~Output(&local_100);
    }
    std::__cxx11::string::~string((string *)&country);
    std::__cxx11::string::~string((string *)&email);
    std::__cxx11::string::~string((string *)&author);
    std::__cxx11::_List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::_M_clear
              (&opts.super__List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>);
  }
  return;
}

Assistant:

void UCIAdapter::UCICommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Uci;
    Output() << "Output engine info and options followed by uciok.";
    return;
  }

  std::list<EngineOption> opts = engine->GetOptions();
  Output(Output::NoPrefix) << "id name " << engine->GetEngineName()
                           << ' ' << engine->GetEngineVersion();

  const std::string author = engine->GetAuthorName();
  if (author.size()) {
    Output(Output::NoPrefix) << "id author " << author;
  }

  const std::string email = engine->GetEmailAddress();
  if (email.size()) {
    Output(Output::NoPrefix) << "id email " << email;
  }

  const std::string country = engine->GetCountryName();
  if (country.size()) {
    Output(Output::NoPrefix) << "id country " << country;
  }

  std::list<EngineOption>::const_iterator opt;
  for (opt = opts.begin(); opt != opts.end(); ++opt) {
    Output out(Output::NoPrefix);
    out << "option name " << opt->GetName() << " type " << opt->GetTypeName();
    if (opt->GetDefaultValue().size()) {
      out << " default " << opt->GetDefaultValue();
    }
    if (opt->GetMinValue() > INT64_MIN) {
      out << " min " << opt->GetMinValue();
    }
    if (opt->GetMaxValue() < INT64_MAX) {
      out << " max " << opt->GetMaxValue();
    }
    const std::set<std::string>& comboValues = opt->GetComboValues();
    std::set<std::string>::const_iterator val;
    for (val = comboValues.begin(); val != comboValues.end(); ++val) {
      out << " var " << *val;
    }
  }

  Output(Output::NoPrefix) << "uciok";

  if (engine->IsCopyProtected()) {
    Output(Output::NoPrefix) << "copyprotection checking";
    if (engine->CopyIsOK()) {
      Output(Output::NoPrefix) << "copyprotection ok";
    }
    else {
      Output(Output::NoPrefix) << "copyprotection error";
    }
  }

  if (!engine->IsRegistered()) {
    Output(Output::NoPrefix) << "registration error";
  }
}